

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall GameBoard::spawn_snake(GameBoard *this)

{
  Snake *this_00;
  Snake *local_18;
  GameBoard *local_10;
  GameBoard *this_local;
  
  local_10 = this;
  this_00 = (Snake *)operator_new(0x68);
  Snake::Snake(this_00,this);
  local_18 = this_00;
  std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back(&this->snakes,&local_18);
  return;
}

Assistant:

void GameBoard::spawn_snake() {
    this->snakes.push_back(new Snake(this));
}